

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::InterpreterStackFrame::InitClassHelper
          (InterpreterStackFrame *this,FrameDisplay *environment,FunctionInfoPtrPtr infoRef,
          RecyclableObject *protoParent,RecyclableObject *constructorParent,RegSlot protoReg)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptLibrary *pJVar5;
  DynamicObject *pDVar6;
  ScriptFunction *this_00;
  ScriptFunction *constructor;
  DynamicObject *proto;
  RegSlot protoReg_local;
  RecyclableObject *constructorParent_local;
  RecyclableObject *protoParent_local;
  FunctionInfoPtrPtr infoRef_local;
  FrameDisplay *environment_local;
  InterpreterStackFrame *this_local;
  
  if (protoParent == (RecyclableObject *)0x0) {
LAB_00f24ccd:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1ec6,
                                "(protoParent && JavascriptOperators::IsObjectOrNull(protoParent))",
                                "protoParent && JavascriptOperators::IsObjectOrNull(protoParent)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  else {
    BVar3 = Js::JavascriptOperators::IsObjectOrNull(protoParent);
    if (BVar3 == 0) goto LAB_00f24ccd;
  }
  if (constructorParent != (RecyclableObject *)0x0) {
    bVar2 = Js::JavascriptOperators::IsConstructor(constructorParent);
    if (bVar2) goto LAB_00f24de8;
    pJVar5 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
    pDVar6 = JavascriptLibraryBase::GetFunctionPrototype(&pJVar5->super_JavascriptLibraryBase);
    if ((DynamicObject *)constructorParent == pDVar6) goto LAB_00f24de8;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x1ec7,
                              "(constructorParent && (JavascriptOperators::IsConstructor(constructorParent) || constructorParent == scriptContext->GetLibrary()->GetFunctionPrototype()))"
                              ,
                              "constructorParent && (JavascriptOperators::IsConstructor(constructorParent) || constructorParent == scriptContext->GetLibrary()->GetFunctionPrototype())"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_00f24de8:
  pJVar5 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
  pDVar6 = JavascriptLibrary::CreateClassPrototypeObject(pJVar5,protoParent);
  this_00 = ScriptFunction::OP_NewClassConstructor(environment,infoRef,pDVar6,constructorParent);
  DynamicObject::SetSlot(pDVar6,-1,false,0,this_00);
  DynamicObject::SetSlot((DynamicObject *)this_00,-1,false,0,pDVar6);
  SetReg<unsigned_int>(this,protoReg,pDVar6);
  return this_00;
}

Assistant:

Var InterpreterStackFrame::InitClassHelper(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, RecyclableObject *protoParent, RecyclableObject *constructorParent, RegSlot protoReg)
    {
        Assert(protoParent && JavascriptOperators::IsObjectOrNull(protoParent));
        Assert(constructorParent && (JavascriptOperators::IsConstructor(constructorParent) || constructorParent == scriptContext->GetLibrary()->GetFunctionPrototype()));

        // Create prototype object with the default class prototype object shape {'constructor': W:T, E:F, C:T} and [[Prototype]] == protoParent
        DynamicObject * proto = scriptContext->GetLibrary()->CreateClassPrototypeObject(protoParent);

        // Create class constructor object for the constructor function, with default constructor shape:
        //    {'prototype': W:F, E:F, C:F}, {'length': W:F, E:F, C:T}, {'name': W:F, E:F, C:T}
        //    [[Prototype]] == constructorParent and [[HomeObject]] == proto
        // The callee initializes the object and the 3 properties.
        ScriptFunction * constructor = ScriptFunction::OP_NewClassConstructor(environment, infoRef, proto, constructorParent);

        proto->SetSlot(SetSlotArguments(Constants::NoProperty, 0, constructor));
        constructor->SetSlot(SetSlotArguments(Constants::NoProperty, 0, proto));

        SetReg(protoReg, proto);
        return constructor;
    }